

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::map_sequence
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,NKmerIndex *nkindex,char *query_sequence_ptr,sgNodeID_t seq_id)

{
  byte bVar1;
  pointer puVar2;
  LongReadsMapper *this_00;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr___00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  StreamKmerFactory skf;
  allocator_type local_2ea;
  bool local_2e9;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> local_2e8
  ;
  vector<bool,_std::allocator<bool>_> local_2d0;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_2a8;
  sgNodeID_t local_290;
  LongReadsMapper *local_288;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  byte local_260;
  long local_258;
  unsigned_long uStack_250;
  unsigned_long local_248;
  ulong local_240;
  long local_238;
  char local_230 [65];
  undefined1 local_1ef;
  undefined1 local_1ed;
  undefined1 local_1e9;
  undefined1 local_1dc;
  undefined1 local_1cf;
  undefined1 local_1cd;
  undefined1 local_1c9;
  undefined1 local_1bc;
  char local_130 [65];
  undefined1 local_ef;
  undefined1 local_ed;
  undefined1 local_e9;
  undefined1 local_dc;
  undefined1 local_cf;
  undefined1 local_cd;
  undefined1 local_c9;
  undefined1 local_bc;
  
  local_260 = this->k;
  local_240 = ~(-1L << ((byte)((uint)local_260 * 2) & 0x3f));
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  local_238 = (ulong)((uint)local_260 * 2) - 2;
  local_290 = seq_id;
  local_280 = __return_storage_ptr__;
  memset(local_230,0,0x100);
  local_230[0] = '\x04';
  memset(local_130,0,0x100);
  memset(local_230,4,0xff);
  memset(local_130,4,0xff);
  local_1ef = 0;
  local_1cf = 0;
  local_1ed = 1;
  local_1cd = 1;
  local_1e9 = 2;
  local_1c9 = 2;
  local_1dc = 3;
  local_1bc = 3;
  local_ef = 3;
  local_cf = 3;
  local_ed = 2;
  local_cd = 2;
  local_e9 = 1;
  local_c9 = 1;
  local_dc = 0;
  local_bc = 0;
  local_2e8.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_278,
             ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2492492492492492,
             (allocator_type *)&local_2d0);
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  while( true ) {
    bVar1 = *query_sequence_ptr;
    if ((bVar1 == 0) || (bVar1 == 10)) break;
    if ((long)local_230[bVar1] == 4) {
      local_258 = 0;
      uVar3 = local_248 << 2;
      uStack_250 = (3L << ((byte)local_238 & 0x3f)) + (uStack_250 >> 2);
    }
    else {
      uVar3 = (long)local_230[bVar1] + local_248 * 4;
      uStack_250 = ((long)local_130[bVar1] << ((byte)local_238 & 0x3f)) + (uStack_250 >> 2);
      local_258 = local_258 + 1;
    }
    local_248 = uVar3 & local_240;
    if ((long)(ulong)local_260 <= local_258) {
      if (local_248 < uStack_250) {
        local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             ((ulong)local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_ << 8);
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>
                  ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                    *)&local_2e8,(bool *)&local_2d0,&local_248);
      }
      else {
        local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT71(local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,1);
        std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
        emplace_back<bool,unsigned_long&>
                  ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                    *)&local_2e8,(bool *)&local_2d0,&uStack_250);
      }
    }
    query_sequence_ptr = (char *)((byte *)query_sequence_ptr + 1);
  }
  local_2e9 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_2d0,
             (long)local_2e8.
                   super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2e8.
                   super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_2e9,&local_2ea);
  this_00 = local_288;
  if ((long)local_2e8.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_2e8.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar7 = (long)local_2e8.
                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2e8.
                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar8 = (ulong)(nkindex->bfilter).dataSz;
    puVar2 = (nkindex->bfilter).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = &(local_2e8.
               super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    uVar3 = 0;
    do {
      uVar5 = *puVar6 % (nkindex->bfilter).estimated_size;
      uVar4 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      lVar9 = (long)uVar4 >> 6;
      uVar10 = (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001);
      uVar4 = 1L << ((byte)uVar3 & 0x3f);
      if ((puVar2[uVar5 / uVar8] >> ((byte)(7 - (char)(uVar5 % uVar8)) & 0x1f) & 1) == 0) {
        uVar4 = ~uVar4 & local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [lVar9 + (uVar10 - 1)];
      }
      else {
        uVar4 = uVar4 | local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                        [lVar9 + (uVar10 - 1)];
      }
      local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[lVar9 + (uVar10 - 1)] = uVar4;
      uVar3 = uVar3 + 1;
      puVar6 = puVar6 + 2;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar3);
  }
  get_all_kmer_matches(local_288,nkindex,&local_2a8,&local_2e8,&local_2d0);
  __return_storage_ptr___00 = local_280;
  count_candidates(this_00,&local_278,&local_2a8,
                   (uint32_t)
                   ((ulong)((long)local_2e8.
                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2e8.
                                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  alignment_blocks(__return_storage_ptr___00,this_00,(uint32_t)local_290,&local_2a8,
                   (uint32_t)
                   ((ulong)((long)local_2e8.
                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2e8.
                                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4),&local_278);
  if (local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_2d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_2a8);
  if (local_2e8.
      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.
                          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.
                          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::map_sequence(const NKmerIndex &nkindex, const char * query_sequence_ptr, sgNodeID_t seq_id) {
    std::vector<LongReadMapping> private_results;

    StreamKmerFactory skf(k);
    std::vector<std::pair<bool, uint64_t>> read_kmers;
    std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
    read_kmers.clear();

    std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
    skf.produce_all_kmers(query_sequence_ptr, read_kmers);

    std::vector<bool> kmer_in_assembly(read_kmers.size());

    for (uint64_t i = 0; i < read_kmers.size(); ++i) {
        kmer_in_assembly[i] = nkindex.filter(read_kmers[i].second);
    }
    get_all_kmer_matches(nkindex, node_matches, read_kmers, kmer_in_assembly);

    //========== 2. Find match candidates in fixed windows ==========

    count_candidates(candidate_counts, node_matches,read_kmers.size());

    //========== 3. Create alignment blocks from candidates ==========

    return alignment_blocks(seq_id,node_matches,read_kmers.size(), candidate_counts);

}